

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet *hashSet,ZSTD_DDict *ddict)

{
  uint uVar1;
  uint uVar2;
  unsigned_long_long uVar3;
  size_t sVar4;
  ZSTD_DDict **ppZVar5;
  size_t sVar6;
  ZSTD_DDict *ddict_00;
  ulong uVar7;
  ulong uVar8;
  uint local_2c;
  
  uVar1 = ZSTD_getDictID_fromDDict(ddict);
  local_2c = uVar1;
  uVar3 = XXH64(&local_2c,4,0);
  sVar6 = hashSet->ddictPtrCount;
  sVar4 = 0xffffffffffffffff;
  if (sVar6 != hashSet->ddictPtrTableSize) {
    uVar7 = hashSet->ddictPtrTableSize - 1;
    uVar8 = uVar3 & uVar7;
    ppZVar5 = hashSet->ddictPtrTable;
    ddict_00 = ppZVar5[uVar8];
    if (ddict_00 != (ZSTD_DDict *)0x0) {
      do {
        uVar2 = ZSTD_getDictID_fromDDict(ddict_00);
        if (uVar2 == uVar1) {
          hashSet->ddictPtrTable[uVar8] = ddict;
          goto LAB_018e9a2b;
        }
        uVar8 = uVar8 & uVar7;
        ppZVar5 = hashSet->ddictPtrTable;
        ddict_00 = ppZVar5[uVar8 + 1];
        uVar8 = uVar8 + 1;
      } while (ddict_00 != (ZSTD_DDict *)0x0);
      sVar6 = hashSet->ddictPtrCount;
    }
    ppZVar5[uVar8] = ddict;
    hashSet->ddictPtrCount = sVar6 + 1;
LAB_018e9a2b:
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

static size_t ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet* hashSet, const ZSTD_DDict* ddict) {
    const U32 dictID = ZSTD_getDictID_fromDDict(ddict);
    size_t idx = ZSTD_DDictHashSet_getIndex(hashSet, dictID);
    const size_t idxRangeMask = hashSet->ddictPtrTableSize - 1;
    RETURN_ERROR_IF(hashSet->ddictPtrCount == hashSet->ddictPtrTableSize, GENERIC, "Hash set is full!");
    DEBUGLOG(4, "Hashed index: for dictID: %u is %zu", dictID, idx);
    while (hashSet->ddictPtrTable[idx] != NULL) {
        /* Replace existing ddict if inserting ddict with same dictID */
        if (ZSTD_getDictID_fromDDict(hashSet->ddictPtrTable[idx]) == dictID) {
            DEBUGLOG(4, "DictID already exists, replacing rather than adding");
            hashSet->ddictPtrTable[idx] = ddict;
            return 0;
        }
        idx &= idxRangeMask;
        idx++;
    }
    DEBUGLOG(4, "Final idx after probing for dictID %u is: %zu", dictID, idx);
    hashSet->ddictPtrTable[idx] = ddict;
    hashSet->ddictPtrCount++;
    return 0;
}